

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

int uv_os_getpriority(uv_pid_t pid,int *priority)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  
  if (priority == (int *)0x0) {
    iVar3 = -0x16;
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0;
    iVar3 = 0;
    iVar1 = getpriority(PRIO_PROCESS,pid);
    if ((iVar1 == -1) && (*piVar2 != 0)) {
      iVar3 = -*piVar2;
    }
    else {
      *priority = iVar1;
    }
  }
  return iVar3;
}

Assistant:

int uv_os_getpriority(uv_pid_t pid, int* priority) {
  int r;

  if (priority == NULL)
    return UV_EINVAL;

  errno = 0;
  r = getpriority(PRIO_PROCESS, (int) pid);

  if (r == -1 && errno != 0)
    return UV__ERR(errno);

  *priority = r;
  return 0;
}